

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d_utils.h
# Opt level: O0

Array2D<interval> *
TNT::operator-(Array2D<interval> *__return_storage_ptr__,Array2D<interval> *A,Array2D<interval> *B)

{
  int iVar1;
  interval *piVar2;
  interval *piVar3;
  long lVar4;
  interval local_50;
  int local_34;
  int local_30;
  int j;
  int i;
  int local_24;
  int n;
  int m;
  Array2D<interval> *B_local;
  Array2D<interval> *A_local;
  Array2D<interval> *C;
  
  _n = B;
  B_local = A;
  A_local = __return_storage_ptr__;
  local_24 = Array2D<interval>::dim1(A);
  i = Array2D<interval>::dim2(B_local);
  iVar1 = Array2D<interval>::dim1(_n);
  if ((iVar1 == local_24) && (iVar1 = Array2D<interval>::dim2(_n), iVar1 == i)) {
    j._3_1_ = 0;
    Array2D<interval>::Array2D(__return_storage_ptr__,local_24,i);
    for (local_30 = 0; local_30 < local_24; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
        piVar2 = Array2D<interval>::operator[](B_local,local_30);
        lVar4 = (long)local_34;
        piVar3 = Array2D<interval>::operator[](_n,local_30);
        ::operator-(&local_50,piVar2 + lVar4,piVar3 + local_34);
        piVar2 = Array2D<interval>::operator[](__return_storage_ptr__,local_30);
        interval::operator=(piVar2 + local_34,&local_50);
      }
    }
  }
  else {
    Array2D<interval>::Array2D(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> operator-(const Array2D<T> &A, const Array2D<T> &B)
{
	int m = A.dim1();
	int n = A.dim2();

	if (B.dim1() != m ||  B.dim2() != n )
		return Array2D<T>();

	else
	{
		Array2D<T> C(m,n);

		for (int i=0; i<m; i++)
		{
			for (int j=0; j<n; j++)
				C[i][j] = A[i][j] - B[i][j];
		}
		return C;
	}
}